

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCom.c
# Opt level: O3

int If_CommandPrintLut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__s;
  If_LibLut_t *pLutLib;
  char *pcVar3;
  
  Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __s = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
  bVar1 = true;
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 != 0x76) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if ((iVar2 == -1) && (globalUtilOptind == argc)) {
    iVar2 = 0;
    pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
    If_LibLutPrint(pLutLib);
  }
  else {
    fwrite("\nusage: print_lut [-vh]\n",0x18,1,__s);
    fwrite("\t          print the current LUT library\n",0x29,1,__s);
    pcVar3 = "yes";
    if (!bVar1) {
      pcVar3 = "no";
    }
    fprintf(__s,"\t-v      : toggles enabling of verbose output [default = %s]\n",pcVar3);
    fwrite("\t-h      : print the command usage\n",0x23,1,__s);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int If_CommandPrintLut( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNet;
    int fVerbose;
    int c;

    pNet = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    fVerbose = 1;
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "vh")) != EOF ) 
    {
        switch (c) 
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }

    if ( argc != globalUtilOptind )
        goto usage;

    // set the new network
    If_LibLutPrint( (If_LibLut_t *)Abc_FrameReadLibLut() );
    return 0;

usage:
    fprintf( pErr, "\nusage: print_lut [-vh]\n");
    fprintf( pErr, "\t          print the current LUT library\n" );  
    fprintf( pErr, "\t-v      : toggles enabling of verbose output [default = %s]\n", (fVerbose? "yes" : "no") );
    fprintf( pErr, "\t-h      : print the command usage\n");
    return 1;       /* error exit */
}